

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O0

string_view trim(string_view s)

{
  string_view sVar1;
  unsigned_long *puVar2;
  size_type sVar3;
  size_type sVar4;
  size_type local_48;
  unsigned_long local_40;
  size_type local_38;
  size_type local_30;
  undefined1 auStack_28 [8];
  string_view s_local;
  
  s_local._M_len = (size_t)s._M_str;
  auStack_28 = (undefined1  [8])s._M_len;
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28," \t\r\v\n",0
                       );
  local_38 = std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28);
  puVar2 = std::min<unsigned_long>(&local_30,&local_38);
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28,*puVar2);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28);
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28," \t\r\v\n",
                     0xffffffffffffffff);
  local_40 = ~sVar4 + sVar3;
  local_48 = std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28);
  puVar2 = std::min<unsigned_long>(&local_40,&local_48);
  std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28,*puVar2);
  sVar1._M_str = (char *)s_local._M_len;
  sVar1._M_len = (size_t)auStack_28;
  return sVar1;
}

Assistant:

string_view trim(string_view s)
{
	s.remove_prefix(min(s.find_first_not_of(" \t\r\v\n"), s.size()));
	s.remove_suffix(min(s.size() - s.find_last_not_of(" \t\r\v\n") - 1, s.size()));
	return s;
}